

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_op_comp(lyxp_set *set1,lyxp_set *set2,char *op,lyd_node *cur_node,lys_module *param_5,
                  int options)

{
  int iVar1;
  LY_ERR *pLVar2;
  bool bVar3;
  uint local_40;
  int result;
  int options_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  char *op_local;
  lyxp_set *set2_local;
  lyxp_set *set1_local;
  
  if ((((set1->type == set2->type) && (set1->type != LYXP_SET_EMPTY)) &&
      (set1->type != LYXP_SET_NODE_SET)) &&
     (((*op == '=' || (*op == '!')) ||
      ((set1->type != LYXP_SET_BOOLEAN && (set1->type != LYXP_SET_STRING)))))) {
    if (*op == '=') {
      if (set1->type == LYXP_SET_BOOLEAN) {
        local_40 = (uint)((set1->val).bool == (set2->val).bool);
      }
      else if (set1->type == LYXP_SET_NUMBER) {
        local_40 = (uint)((set1->val).num == (set2->val).num);
      }
      else {
        local_40 = ly_strequal_((set1->val).str,(set2->val).str);
      }
    }
    else {
      if (*op == '!') {
        if (set1->type == LYXP_SET_BOOLEAN) {
          bVar3 = (set1->val).bool != (set2->val).bool;
        }
        else if (set1->type == LYXP_SET_NUMBER) {
          bVar3 = (set1->val).num != (set2->val).num;
        }
        else {
          iVar1 = ly_strequal_((set1->val).str,(set2->val).str);
          bVar3 = (bool)((iVar1 != 0 ^ 0xffU) & 1);
        }
      }
      else {
        if (set1->type != LYXP_SET_NUMBER) {
          pLVar2 = ly_errno_location();
          *pLVar2 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                 ,0x15a1);
          return -1;
        }
        if (*op == '<') {
          if (op[1] == '=') {
            bVar3 = (set1->val).num <= (set2->val).num;
          }
          else {
            bVar3 = (set1->val).num < (set2->val).num;
          }
        }
        else if (op[1] == '=') {
          bVar3 = (set2->val).num <= (set1->val).num;
        }
        else {
          bVar3 = (set2->val).num < (set1->val).num;
        }
      }
      local_40 = (uint)bVar3;
    }
    if (local_40 == 0) {
      set_fill_boolean(set1,0);
    }
    else {
      set_fill_boolean(set1,1);
    }
    lyxp_set_cast(set2,LYXP_SET_EMPTY,cur_node,param_5,options);
    return 0;
  }
  if ((((set1->type == LYXP_SET_NODE_SET) || (set1->type == LYXP_SET_EMPTY)) ||
      (set1->type == LYXP_SET_STRING)) &&
     ((((set2->type == LYXP_SET_NODE_SET || (set2->type == LYXP_SET_EMPTY)) ||
       (set2->type == LYXP_SET_STRING)) &&
      ((set1->type != LYXP_SET_STRING || (set2->type != LYXP_SET_STRING)))))) {
    iVar1 = lyxp_set_cast(set1,LYXP_SET_STRING,cur_node,param_5,options);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = lyxp_set_cast(set2,LYXP_SET_STRING,cur_node,param_5,options);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else if ((((set1->type == LYXP_SET_NODE_SET) ||
            ((set1->type == LYXP_SET_EMPTY || (set1->type == LYXP_SET_BOOLEAN)))) &&
           ((set2->type == LYXP_SET_NODE_SET ||
            ((set2->type == LYXP_SET_EMPTY || (set2->type == LYXP_SET_BOOLEAN)))))) ||
          (((*op == '=' || (*op == '!')) &&
           ((set1->type == LYXP_SET_BOOLEAN || (set2->type == LYXP_SET_BOOLEAN)))))) {
    lyxp_set_cast(set1,LYXP_SET_BOOLEAN,cur_node,param_5,options);
    lyxp_set_cast(set2,LYXP_SET_BOOLEAN,cur_node,param_5,options);
  }
  else {
    iVar1 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = lyxp_set_cast(set2,LYXP_SET_NUMBER,cur_node,param_5,options);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = moveto_op_comp(set1,set2,op,cur_node,param_5,options);
  return iVar1;
}

Assistant:

static int
moveto_op_comp(struct lyxp_set *set1, struct lyxp_set *set2, const char *op, struct lyd_node *cur_node,
               struct lys_module *local_mod, int options)
{
    /*
     * NODE SET + NODE SET = STRING + STRING  /1 STRING, 2 STRING
     * NODE SET + STRING = STRING + STRING    /1 STRING (2 STRING)
     * NODE SET + NUMBER = NUMBER + NUMBER    /1 NUMBER (2 NUMBER)
     * NODE SET + BOOLEAN = BOOLEAN + BOOLEAN /1 BOOLEAN (2 BOOLEAN)
     * STRING + NODE SET = STRING + STRING    /(1 STRING) 2 STRING
     * NUMBER + NODE SET = NUMBER + NUMBER    /(1 NUMBER) 2 NUMBER
     * BOOLEAN + NODE SET = BOOLEAN + BOOLEAN /(1 BOOLEAN) 2 BOOLEAN
     *
     * '=' or '!='
     * BOOLEAN + BOOLEAN
     * BOOLEAN + STRING = BOOLEAN + BOOLEAN   /(1 BOOLEAN) 2 BOOLEAN
     * BOOLEAN + NUMBER = BOOLEAN + BOOLEAN   /(1 BOOLEAN) 2 BOOLEAN
     * STRING + BOOLEAN = BOOLEAN + BOOLEAN   /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + BOOLEAN = BOOLEAN + BOOLEAN   /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + NUMBER
     * NUMBER + STRING = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER      /1 NUMBER (2 NUMBER)
     * STRING + STRING
     *
     * '<=', '<', '>=', '>'
     * NUMBER + NUMBER
     * BOOLEAN + BOOLEAN = NUMBER + NUMBER    /1 NUMBER, 2 NUMBER
     * BOOLEAN + NUMBER = NUMBER + NUMBER     /1 NUMBER (2 NUMBER)
     * BOOLEAN + STRING = NUMBER + NUMBER     /1 NUMBER, 2 NUMBER
     * NUMBER + STRING = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     * STRING + STRING = NUMBER + NUMBER      /1 NUMBER, 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER      /1 NUMBER (2 NUMBER)
     * NUMBER + BOOLEAN = NUMBER + NUMBER     /(1 NUMBER) 2 NUMBER
     * STRING + BOOLEAN = NUMBER + NUMBER     /(1 NUMBER) 2 NUMBER
     */
    int result;

    /* we can evaluate it immediately */
    if ((set1->type == set2->type) && (set1->type != LYXP_SET_EMPTY) && (set1->type != LYXP_SET_NODE_SET)
            && (((op[0] == '=') || (op[0] == '!')) || ((set1->type != LYXP_SET_BOOLEAN) && (set1->type != LYXP_SET_STRING)))) {

        /* compute result */
        if (op[0] == '=') {
            if (set1->type == LYXP_SET_BOOLEAN) {
                result = (set1->val.bool == set2->val.bool);
            } else if (set1->type == LYXP_SET_NUMBER) {
                result = (set1->val.num == set2->val.num);
            } else {
                result = (ly_strequal(set1->val.str, set2->val.str, 0));
            }
        } else if (op[0] == '!') {
            if (set1->type == LYXP_SET_BOOLEAN) {
                result = (set1->val.bool != set2->val.bool);
            } else if (set1->type == LYXP_SET_NUMBER) {
                result = (set1->val.num != set2->val.num);
            } else {
                result = (!ly_strequal(set1->val.str, set2->val.str, 0));
            }
        } else {
            if (set1->type != LYXP_SET_NUMBER) {
                LOGINT;
                return -1;
            }

            if (op[0] == '<') {
                if (op[1] == '=') {
                    result = (set1->val.num <= set2->val.num);
                } else {
                    result = (set1->val.num < set2->val.num);
                }
            } else {
                if (op[1] == '=') {
                    result = (set1->val.num >= set2->val.num);
                } else {
                    result = (set1->val.num > set2->val.num);
                }
            }
        }

        /* assign result */
        if (result) {
            set_fill_boolean(set1, 1);
        } else {
            set_fill_boolean(set1, 0);
        }

        lyxp_set_cast(set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return EXIT_SUCCESS;
    }

    /* convert first */
    if (((set1->type == LYXP_SET_NODE_SET) || (set1->type == LYXP_SET_EMPTY) || (set1->type == LYXP_SET_STRING))
            && ((set2->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_EMPTY) || (set2->type == LYXP_SET_STRING))
            && ((set1->type != LYXP_SET_STRING) || (set2->type != LYXP_SET_STRING))) {
        if (lyxp_set_cast(set1, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        if (lyxp_set_cast(set2, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }

    } else if ((((set1->type == LYXP_SET_NODE_SET) || (set1->type == LYXP_SET_EMPTY) || (set1->type == LYXP_SET_BOOLEAN))
            && ((set2->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_EMPTY) || (set2->type == LYXP_SET_BOOLEAN)))
            || (((op[0] == '=') || (op[0] == '!')) && ((set1->type == LYXP_SET_BOOLEAN) || (set2->type == LYXP_SET_BOOLEAN)))) {
        lyxp_set_cast(set1, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        lyxp_set_cast(set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);

    } else {
        if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
        if (lyxp_set_cast(set2, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
    }

    /* now we can evaluate */
    return moveto_op_comp(set1, set2, op, cur_node, local_mod, options);
}